

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_rela589n.cxx
# Opt level: O2

void newGenerationSort(int64_t **arr,int len)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  int64_t *piVar5;
  int64_t *piVar6;
  uint uVar7;
  int j;
  ulong uVar8;
  int iVar9;
  long *plVar10;
  int len_00;
  long lVar11;
  long __tmp;
  int len_01;
  ulong uVar12;
  long lenB;
  int64_t lenA;
  int64_t *restSecond;
  int64_t *restFirst;
  ulong local_50;
  int64_t *part2;
  int64_t *local_40;
  int64_t **local_38;
  
  local_50 = 8;
  if (len < 8) {
    local_50 = (ulong)(uint)len;
  }
  piVar6 = *arr;
  uVar3 = 1;
  uVar7 = 1;
  if (1 < (int)(uint)local_50) {
    uVar7 = (uint)local_50;
  }
  do {
    uVar2 = uVar3;
    if (uVar3 == uVar7) {
      if (8 < len) {
        uVar12 = 0xffffffffffffffff;
        if (-1 < len * 2) {
          uVar12 = (ulong)(uint)(len * 2) * 8;
        }
        local_38 = arr;
        pvVar4 = operator_new__(uVar12);
        *(int64_t *)((long)pvVar4 + (ulong)(uint)len * 8 + -8) = *piVar6;
        uVar12 = local_50 & 0xffffffff;
        for (lVar11 = 0; uVar12 - 1 != lVar11; lVar11 = lVar11 + 1) {
          *(int64_t *)((long)pvVar4 + lVar11 * 8 + (ulong)(uint)len * 8) = piVar6[lVar11 + 1];
        }
        uVar3 = len - 2;
        iVar9 = len + (int)lVar11;
        uVar8 = (ulong)((uint)len >> 1) << 3;
        piVar5 = (int64_t *)operator_new__(uVar8);
        restFirst = piVar5;
        restSecond = (int64_t *)operator_new__(uVar8);
        len_00 = 0;
        len_01 = 0;
        while( true ) {
          lVar11 = (long)len_00;
          lenB = (long)len_01;
          if (len <= (int)uVar12) break;
          lVar1 = piVar6[uVar12];
          if (lVar1 < *(long *)((long)pvVar4 + (long)(iVar9 - (int)local_50) * 8)) {
            if (*(long *)((long)pvVar4 + (long)(int)(uVar3 + (int)local_50) * 8) < lVar1) {
              if ((uVar12 & 1) == 0) {
                len_01 = len_01 + 1;
                restSecond[lenB] = lVar1;
              }
              else {
                len_00 = len_00 + 1;
                piVar5[lVar11] = lVar1;
              }
            }
            else {
              plVar10 = (long *)((long)pvVar4 + (long)(int)uVar3 * 8);
              while( true ) {
                *plVar10 = lVar1;
                if (lVar1 < plVar10[1]) break;
                *plVar10 = plVar10[1];
                plVar10 = plVar10 + 1;
              }
              uVar3 = uVar3 - 1;
            }
          }
          else {
            *(long *)((long)pvVar4 + (long)iVar9 * 8) = lVar1;
            for (plVar10 = (long *)((long)pvVar4 + (long)iVar9 * 8 + -8); lVar11 = *plVar10,
                lVar1 < lVar11; plVar10 = plVar10 + -1) {
              *plVar10 = lVar1;
              plVar10[1] = lVar11;
            }
            iVar9 = iVar9 + 1;
          }
          uVar12 = uVar12 + 1;
        }
        safe_delete(piVar6);
        iVar9 = iVar9 + ~uVar3;
        lenA = (int64_t)iVar9;
        piVar6 = glue((int64_t *)((long)pvVar4 + (long)(int)uVar3 * 8 + 8),lenA,(int64_t *)0x0,0);
        operator_delete__(pvVar4);
        local_40 = piVar6;
        newGenerationSort(&restFirst,len_00);
        newGenerationSort(&restSecond,len_01);
        if (iVar9 < len_00) {
          glueDelete(&local_40,&restFirst,lVar11,&local_40,lenA);
          part2 = restSecond;
          lenA = (int64_t)(iVar9 + len_00);
        }
        else {
          glueDelete(&part2,&restFirst,lVar11,&restSecond,lenB);
          len_01 = len_01 + len_00;
        }
        glueDelete(local_38,&local_40,lenA,&part2,(long)len_01);
      }
      return;
    }
    for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      lVar11 = piVar6[(ulong)uVar2 - 1];
      if (lVar11 <= piVar6[uVar2]) break;
      piVar6[(ulong)uVar2 - 1] = piVar6[uVar2];
      piVar6[uVar2] = lVar11;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void newGenerationSort(SORT_TYPE *&arr, int len) {
  int localCatchUp =
      min(catchUp, len); // потому что мы не можем пытаться вставлять элемент за
                         // границами массива
  insertionSort(arr, 0,
                localCatchUp -
                    1); // для начала сортируем первые localCatchUp элементов

  if (len <=
      localCatchUp) // на случай если это массив на n <= catchUp элементов
    return;         // а также это база рекурсии

  SORT_TYPE *selection =
      new SORT_TYPE[len << 1]; // то же что и new int[len * 2]
  int left = len - 1; // индекс для хранения новых минимальных элементов
  int right = len; // индекс для хранения новых максимальных элементов

  selection[left--] = arr[0];
  for (int i = 1; i < localCatchUp; ++i) {
    selection[right++] = arr[i];
  }

  int restLen = len >> 1;
  SORT_TYPE *restFirst = new SORT_TYPE[restLen];
  SORT_TYPE *restSecond = new SORT_TYPE[restLen];

  int restFirstLen = 0;
  int restSecondLen = 0;

  for (int i = localCatchUp; i < len; ++i) {

    if (selection[right - localCatchUp] <= arr[i]) {
      selection[right] = arr[i];

      for (int j = right; selection[j - 1] > selection[j]; --j)
        swap(selection[j - 1], selection[j]);

      ++right;
      continue;
    }

    if (selection[left + localCatchUp] >= arr[i]) {
      selection[left] = arr[i];

      for (int j = left; selection[j] >= selection[j + 1]; ++j)
        swap(selection[j], selection[j + 1]);

      --left;
      continue;
    }

    if (i & 1) { // i - непарное
      restFirst[restFirstLen++] = arr[i];
    } else {
      restSecond[restSecondLen++] = arr[i];
    }
  }
  safe_delete(arr);

  int selectionLen = right - left - 1; // просто длина нашей выборки
  SORT_TYPE *copy = glue(selection + left + 1, selectionLen, nullptr,
                         0); // копируем все элементы выборки в новый массив

  delete[] selection; // удаляем массив размером 2 * len элементов и
  selection =
      copy; // вместо него используем ровно столько памяти, сколько нужно

  newGenerationSort(restFirst, restFirstLen);
  newGenerationSort(restSecond, restSecondLen);

  SORT_TYPE *part2;
  int part2Len;
  if (selectionLen < restFirstLen) {
    glueDelete(selection, restFirst, restFirstLen, selection,
               selectionLen); // selection += restFirst
    selectionLen += restFirstLen;

    part2 = restSecond;
    part2Len = restSecondLen;
  } else {
    glueDelete(part2, restFirst, restFirstLen, restSecond,
               restSecondLen); // part2 = restFirst + restSecond
    part2Len = restFirstLen + restSecondLen;
  }

  glueDelete(arr, selection, selectionLen, part2, part2Len);
}